

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QDateEdit::QDateEdit(QDateEdit *this,QWidget *parent)

{
  undefined4 *puVar1;
  long in_FS_OFFSET;
  code *local_70;
  ImplFn local_68;
  QObject local_60 [8];
  QDate local_58;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QDate::QDate(&local_58,2000,1,1);
  ::QVariant::QVariant(&local_50,local_58);
  QDateTimeEdit::QDateTimeEdit(&this->super_QDateTimeEdit,&local_50,QDate,parent);
  ::QVariant::~QVariant(&local_50);
  *(undefined ***)&(this->super_QDateTimeEdit).super_QAbstractSpinBox.super_QWidget =
       &PTR_metaObject_007ff320;
  *(undefined ***)
   &(this->super_QDateTimeEdit).super_QAbstractSpinBox.super_QWidget.super_QPaintDevice =
       &PTR__QDateEdit_007ff510;
  local_70 = userDateChanged;
  local_68 = (ImplFn)0x0;
  local_50.d.data.shared = (PrivateShared *)QDateTimeEdit::dateChanged;
  local_50.d.data._8_8_ = 0;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::QCallableObject<void_(QDateEdit::*)(QDate),_QtPrivate::List<QDate>,_void>::impl;
  *(code **)(puVar1 + 4) = userDateChanged;
  *(undefined8 *)(puVar1 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)this,(QObject *)&local_50,(void **)this,(QSlotObjectBase *)&local_70,
             (ConnectionType)puVar1,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDateEdit::QDateEdit(QWidget *parent)
    : QDateTimeEdit(QDATETIMEEDIT_DATE_INITIAL, QMetaType::QDate, parent)
{
    connect(this, &QDateEdit::dateChanged, this, &QDateEdit::userDateChanged);
}